

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  string *value1;
  _Bit_iterator *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cpp *this_00;
  string *psVar4;
  FieldDescriptor *pFVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  long *plVar9;
  undefined8 *puVar10;
  pointer ppFVar11;
  Descriptor *pDVar12;
  long lVar13;
  FieldGenerator *pFVar14;
  Options *in_RCX;
  size_type *psVar15;
  _Bit_type *p_Var16;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar17;
  Descriptor *in_RDX;
  FieldDescriptor *field;
  size_type sVar18;
  long lVar19;
  undefined8 uVar20;
  char *text;
  _Alloc_hider _Var21;
  long lVar22;
  difference_type __n;
  long lVar23;
  ulong uVar24;
  string local_158;
  vector<bool,_std::allocator<bool>_> processed;
  string initializer_null;
  string cached_size_decl;
  string out;
  string initializer_with_arena;
  string superclass;
  vector<bool,_std::allocator<bool>_> local_58;
  
  superclass._M_dataplus._M_p = (pointer)&superclass.field_2;
  superclass._M_string_length = 0;
  superclass.field_2._M_local_buf[0] = '\0';
  if (this->use_dependent_base_ == true) {
    DependentBaseClassTemplateName_abi_cxx11_(&cached_size_decl,(cpp *)this->descriptor_,in_RDX);
    plVar9 = (long *)std::__cxx11::string::append((char *)&cached_size_decl);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar15) {
      initializer_null.field_2._M_allocated_capacity = *psVar15;
      initializer_null.field_2._8_8_ = plVar9[3];
      initializer_null._M_dataplus._M_p = (pointer)&initializer_null.field_2;
    }
    else {
      initializer_null.field_2._M_allocated_capacity = *psVar15;
      initializer_null._M_dataplus._M_p = (pointer)*plVar9;
    }
    initializer_null._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&initializer_null,(ulong)(this->classname_)._M_dataplus._M_p
                               );
    psVar15 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar15) {
      initializer_with_arena.field_2._M_allocated_capacity = *psVar15;
      initializer_with_arena.field_2._8_8_ = plVar9[3];
      initializer_with_arena._M_dataplus._M_p = (pointer)&initializer_with_arena.field_2;
    }
    else {
      initializer_with_arena.field_2._M_allocated_capacity = *psVar15;
      initializer_with_arena._M_dataplus._M_p = (pointer)*plVar9;
    }
    initializer_with_arena._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&initializer_with_arena);
    p_Var1 = &processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
    p_Var16 = (_Bit_type *)(plVar9 + 2);
    if ((_Bit_type *)*plVar9 == p_Var16) {
      processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*p_Var16;
      processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = plVar9[3];
      processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)p_Var1;
    }
    else {
      processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*p_Var16;
      processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    }
    processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = plVar9[1];
    *plVar9 = (long)p_Var16;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&superclass,(string *)&processed);
    if ((_Bit_iterator *)
        processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var1) {
      operator_delete(processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)initializer_with_arena._M_dataplus._M_p != &initializer_with_arena.field_2) {
      operator_delete(initializer_with_arena._M_dataplus._M_p,
                      initializer_with_arena.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)initializer_null._M_dataplus._M_p != &initializer_null.field_2) {
      operator_delete(initializer_null._M_dataplus._M_p,
                      initializer_null.field_2._M_allocated_capacity + 1);
    }
    uVar20 = cached_size_decl.field_2._M_allocated_capacity;
    _Var21._M_p = cached_size_decl._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cached_size_decl._M_dataplus._M_p == &cached_size_decl.field_2) goto LAB_00257907;
  }
  else {
    SuperClassName_abi_cxx11_
              ((string *)&processed,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
    std::__cxx11::string::operator=((string *)&superclass,(string *)&processed);
    uVar20 = processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
    _Var21._M_p = (pointer)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    if ((_Bit_iterator *)
        processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p ==
        &processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish) goto LAB_00257907;
  }
  operator_delete(_Var21._M_p,uVar20 + 1);
LAB_00257907:
  initializer_with_arena._M_dataplus._M_p = (pointer)&initializer_with_arena.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&initializer_with_arena,superclass._M_dataplus._M_p,
             superclass._M_dataplus._M_p + superclass._M_string_length);
  std::__cxx11::string::append((char *)&initializer_with_arena);
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    std::__cxx11::string::append((char *)&initializer_with_arena);
  }
  std::__cxx11::string::append((char *)&initializer_with_arena);
  ppFVar11 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
    paVar3 = &cached_size_decl.field_2;
    paVar2 = &initializer_null.field_2;
    p_Var1 = &processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
    uVar24 = 0;
    do {
      this_00 = (cpp *)ppFVar11[uVar24];
      if (*(int *)(this_00 + 0x4c) == 3) {
        cached_size_decl._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&cached_size_decl,",\n  ","");
        FieldName_abi_cxx11_(&local_158,this_00,field);
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cached_size_decl._M_dataplus._M_p != paVar3) {
          uVar20 = cached_size_decl.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_158._M_string_length + cached_size_decl._M_string_length) {
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
              &local_158.field_2) {
            uVar20 = local_158.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < local_158._M_string_length + cached_size_decl._M_string_length)
          goto LAB_00257a22;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_158,0,(char *)0x0,
                               (ulong)cached_size_decl._M_dataplus._M_p);
        }
        else {
LAB_00257a22:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&cached_size_decl,
                               CONCAT71(local_158._M_dataplus._M_p._1_7_,
                                        local_158._M_dataplus._M_p._0_1_));
        }
        psVar15 = puVar10 + 2;
        if ((size_type *)*puVar10 == psVar15) {
          initializer_null.field_2._M_allocated_capacity = *psVar15;
          initializer_null.field_2._8_8_ = puVar10[3];
          initializer_null._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          initializer_null.field_2._M_allocated_capacity = *psVar15;
          initializer_null._M_dataplus._M_p = (pointer)*puVar10;
        }
        initializer_null._M_string_length = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(char *)psVar15 = '\0';
        out._M_dataplus._M_p = (pointer)&out.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&out,"_(arena)","");
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)initializer_null._M_dataplus._M_p != paVar2) {
          uVar20 = initializer_null.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < out._M_string_length + initializer_null._M_string_length) {
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) {
            uVar20 = out.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < out._M_string_length + initializer_null._M_string_length)
          goto LAB_00257afb;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&out,0,(char *)0x0,(ulong)initializer_null._M_dataplus._M_p);
        }
        else {
LAB_00257afb:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&initializer_null,(ulong)out._M_dataplus._M_p);
        }
        p_Var16 = puVar10 + 2;
        if ((_Bit_type *)*puVar10 == p_Var16) {
          processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*p_Var16;
          processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ = puVar10[3];
          processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)p_Var1;
        }
        else {
          processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*p_Var16;
          processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar10;
        }
        processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ = puVar10[1];
        *puVar10 = p_Var16;
        puVar10[1] = 0;
        *(undefined1 *)p_Var16 = 0;
        std::__cxx11::string::_M_append
                  ((char *)&initializer_with_arena,
                   (ulong)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        if ((_Bit_iterator *)
            processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != p_Var1) {
          operator_delete(processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != &out.field_2) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)initializer_null._M_dataplus._M_p != paVar2) {
          operator_delete(initializer_null._M_dataplus._M_p,
                          initializer_null.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
            &local_158.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_
                                  ),local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cached_size_decl._M_dataplus._M_p != paVar3) {
          operator_delete(cached_size_decl._M_dataplus._M_p,
                          cached_size_decl.field_2._M_allocated_capacity + 1);
        }
      }
      uVar24 = uVar24 + 1;
      ppFVar11 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)((long)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3
                             ));
  }
  bVar6 = IsAnyMessage(this->descriptor_);
  if (bVar6) {
    std::__cxx11::string::append((char *)&initializer_with_arena);
  }
  if (0 < this->num_weak_fields_) {
    std::__cxx11::string::append((char *)&initializer_with_arena);
  }
  initializer_null._M_dataplus._M_p = (pointer)&initializer_null.field_2;
  initializer_null._M_string_length = 0;
  initializer_null.field_2._M_allocated_capacity =
       initializer_null.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::_M_replace((ulong)&initializer_null,0,(char *)0x0,0x368964);
  bVar6 = IsAnyMessage(this->descriptor_);
  if (bVar6) {
    std::__cxx11::string::append((char *)&initializer_null);
  }
  if (0 < this->num_weak_fields_) {
    std::__cxx11::string::append((char *)&initializer_null);
  }
  psVar4 = *(string **)(this->descriptor_ + 8);
  FileLevelNamespace((string *)&processed,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  value1 = &this->classname_;
  io::Printer::Print(printer,
                     "$classname$::$classname$()\n  : $superclass$()$initializer$ {\n  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {\n    $file_namespace$::InitDefaults();\n  }\n  SharedCtor();\n  // @@protoc_insertion_point(constructor:$full_name$)\n}\n"
                     ,"classname",value1,"superclass",&superclass,"full_name",psVar4,"initializer",
                     &initializer_null,"file_namespace",(string *)&processed);
  p_Var1 = &processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
  if ((_Bit_iterator *)
      processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var1) {
    operator_delete(processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1);
  }
  pDVar12 = this->descriptor_;
  if (*(char *)(*(long *)(*(long *)(pDVar12 + 0x10) + 0xa0) + 0xa7) == '\x01') {
    psVar4 = *(string **)(pDVar12 + 8);
    FileLevelNamespace((string *)&processed,(string *)**(undefined8 **)(pDVar12 + 0x10));
    io::Printer::Print(printer,
                       "$classname$::$classname$(::google::protobuf::Arena* arena)\n  : $initializer$ {\n#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n  $file_namespace$::InitDefaults();\n#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n  SharedCtor();\n  RegisterArenaDtor(arena);\n  // @@protoc_insertion_point(arena_constructor:$full_name$)\n}\n"
                       ,"initializer",&initializer_with_arena,"classname",value1,"superclass",
                       &superclass,"full_name",psVar4,"file_namespace",(string *)&processed);
    if ((_Bit_iterator *)
        processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var1) {
      operator_delete(processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1);
    }
  }
  io::Printer::Print(printer,"$classname$::$classname$(const $classname$& from)\n  : $superclass$()"
                     ,"classname",value1,"superclass",&superclass,"full_name",
                     *(string **)(this->descriptor_ + 8));
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,",\n_internal_metadata_(NULL)");
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,",\n_has_bits_(from._has_bits_)");
  }
  cached_size_decl._M_dataplus._M_p = (pointer)&cached_size_decl.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cached_size_decl,",\n_cached_size_(0)","");
  bVar6 = true;
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    iVar17 = this->max_has_bit_index_;
    uVar8 = iVar17 + 0x3e;
    if (-1 < (int)(iVar17 + 0x1fU)) {
      uVar8 = iVar17 + 0x1fU;
    }
    if ((0xffffffc0 < iVar17 - 1U) || ((uVar8 >> 5 & 1) != 0)) {
      io::Printer::Print(printer,cached_size_decl._M_dataplus._M_p);
      bVar6 = false;
    }
  }
  local_158._M_dataplus._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&processed,
             (long)(this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_158,
             (allocator_type *)&out);
  ppFVar11 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
    uVar24 = 0;
    do {
      pFVar5 = ppFVar11[uVar24];
      if ((*(int *)(pFVar5 + 0x4c) == 3) && (bVar7 = FieldDescriptor::is_map(pFVar5), !bVar7)) {
        processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[(long)(uVar24 >> 6)] =
             processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[(long)(uVar24 >> 6)] |
             1L << ((byte)uVar24 & 0x3f);
        FieldName_abi_cxx11_(&local_158,(cpp *)pFVar5,(FieldDescriptor *)(uVar24 >> 6));
        io::Printer::Print(printer,",\n$name$_(from.$name$_)","name",&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
            &local_158.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_
                                  ),local_158.field_2._M_allocated_capacity + 1);
        }
      }
      uVar24 = uVar24 + 1;
      ppFVar11 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)((long)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3
                             ));
  }
  if (bVar6) {
    io::Printer::Print(printer,cached_size_decl._M_dataplus._M_p);
  }
  bVar6 = IsAnyMessage(this->descriptor_);
  if (bVar6) {
    io::Printer::Print(printer,",\n_any_metadata_(&type_url_, &value_)");
  }
  if (0 < this->num_weak_fields_) {
    io::Printer::Print(printer,",\n_weak_field_map_(from._weak_field_map_)");
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," {\n");
  io::Printer::Print(printer,"_internal_metadata_.MergeFrom(from._internal_metadata_);\n");
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"_extensions_.MergeFrom(from._extensions_);\n");
  }
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,&processed);
  GenerateConstructorBody(this,printer,&local_58,true);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x38)) {
    lVar19 = 0;
    do {
      lVar23 = lVar19 * 0x30;
      io::Printer::Print(printer,"clear_has_$oneofname$();\nswitch (from.$oneofname$_case()) {\n",
                         "oneofname",*(string **)(*(long *)(pDVar12 + 0x40) + lVar23));
      io::Printer::Indent(printer);
      lVar13 = *(long *)(this->descriptor_ + 0x40);
      iVar17 = extraout_EDX;
      if (0 < *(int *)(lVar13 + 0x1c + lVar23)) {
        lVar22 = 0;
        do {
          pFVar5 = *(FieldDescriptor **)(*(long *)(lVar13 + 0x20 + lVar23) + lVar22 * 8);
          UnderscoresToCamelCase(&local_158,*(string **)pFVar5,true);
          io::Printer::Print(printer,"case k$field_name$: {\n","field_name",&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
              &local_158.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_158._M_dataplus._M_p._1_7_,
                                     local_158._M_dataplus._M_p._0_1_),
                            local_158.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pFVar14 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
          (*pFVar14->_vptr_FieldGenerator[0xb])(pFVar14,printer);
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          lVar22 = lVar22 + 1;
          lVar13 = *(long *)(this->descriptor_ + 0x40);
          iVar17 = extraout_EDX_00;
        } while (lVar22 < *(int *)(lVar13 + 0x1c + lVar23));
      }
      SimpleItoa_abi_cxx11_
                (&local_158,
                 (protobuf *)
                 (ulong)(uint)((int)((ulong)((lVar13 + lVar23) -
                                            *(long *)(*(long *)(lVar13 + lVar23 + 0x10) + 0x40)) >>
                                    4) * -0x55555555),iVar17);
      plVar9 = *(long **)(*(long *)(this->descriptor_ + 0x40) + lVar23);
      lVar13 = *plVar9;
      out._M_dataplus._M_p = (pointer)&out.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&out,lVar13,plVar9[1] + lVar13);
      if (out._M_string_length != 0) {
        sVar18 = 0;
        do {
          if ((byte)(out._M_dataplus._M_p[sVar18] + 0x9fU) < 0x1a) {
            out._M_dataplus._M_p[sVar18] = out._M_dataplus._M_p[sVar18] + -0x20;
          }
          sVar18 = sVar18 + 1;
        } while (out._M_string_length != sVar18);
      }
      io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","oneof_index",
                         &local_158,"cap_oneof_name",&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != &out.field_2) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
          &local_158.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                        local_158.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      lVar19 = lVar19 + 1;
      pDVar12 = this->descriptor_;
    } while (lVar19 < *(int *)(pDVar12 + 0x38));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  // @@protoc_insertion_point(copy_constructor:$full_name$)\n}\n\n",
                     "full_name",*(string **)(this->descriptor_ + 8));
  GenerateSharedConstructorCode(this,printer);
  io::Printer::Print(printer,
                     "$classname$::~$classname$() {\n  // @@protoc_insertion_point(destructor:$full_name$)\n  SharedDtor();\n}\n\n"
                     ,"classname",value1,"full_name",*(string **)(this->descriptor_ + 8));
  GenerateSharedDestructorCode(this,printer);
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa7) == '\x01') {
    GenerateArenaDestructorCode(this,printer);
  }
  io::Printer::Print(printer,
                     "void $classname$::SetCachedSize(int size) const {\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n}\n"
                     ,"classname",value1);
  if ((((this->options_).enforce_lite == false) &&
      (pDVar12 = this->descriptor_,
      *(int *)(*(long *)(*(long *)(pDVar12 + 0x10) + 0xa0) + 0xa8) != 3)) &&
     (*(char *)(*(long *)(pDVar12 + 0x20) + 0x69) == '\0')) {
    FileLevelNamespace(&local_158,(string *)**(undefined8 **)(pDVar12 + 0x10));
    io::Printer::Print(printer,
                       "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[kIndexInFileMessages].descriptor;\n}\n\n"
                       ,"classname",value1,"file_namespace",&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                      local_158.field_2._M_allocated_capacity + 1);
    }
  }
  FileLevelNamespace(&local_158,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  io::Printer::Print(printer,
                     "const $classname$& $classname$::default_instance() {\n  $file_namespace$::InitDefaults();\n  return *internal_default_instance();\n}\n\n"
                     ,"classname",value1,"file_namespace",&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
      &local_158.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                    local_158.field_2._M_allocated_capacity + 1);
  }
  text = 
  "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n  $classname$* n = new $classname$;\n  if (arena != NULL) {\n    arena->Own(n);\n  }\n  return n;\n}\n"
  ;
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa7) != '\0') {
    text = 
    "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n  return ::google::protobuf::Arena::CreateMessage<$classname$>(arena);\n}\n"
    ;
  }
  io::Printer::Print(printer,text,"classname",value1);
  if (processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cached_size_decl._M_dataplus._M_p != &cached_size_decl.field_2) {
    operator_delete(cached_size_decl._M_dataplus._M_p,
                    cached_size_decl.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)initializer_null._M_dataplus._M_p != &initializer_null.field_2) {
    operator_delete(initializer_null._M_dataplus._M_p,
                    initializer_null.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)initializer_with_arena._M_dataplus._M_p != &initializer_with_arena.field_2) {
    operator_delete(initializer_with_arena._M_dataplus._M_p,
                    initializer_with_arena.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)superclass._M_dataplus._M_p != &superclass.field_2) {
    operator_delete(superclass._M_dataplus._M_p,
                    CONCAT71(superclass.field_2._M_allocated_capacity._1_7_,
                             superclass.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateStructors(io::Printer* printer) {
  string superclass;
  if (use_dependent_base_) {
    superclass =
        DependentBaseClassTemplateName(descriptor_) + "<" + classname_ + ">";
  } else {
    superclass = SuperClassName(descriptor_, options_);
  }
  string initializer_with_arena = superclass + "()";

  if (descriptor_->extension_range_count() > 0) {
    initializer_with_arena += ",\n  _extensions_(arena)";
  }

  initializer_with_arena += ",\n  _internal_metadata_(arena)";

  // Initialize member variables with arena constructor.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];

    bool has_arena_constructor = field->is_repeated();
    if (has_arena_constructor) {
      initializer_with_arena += string(",\n  ") +
          FieldName(field) + string("_(arena)");
    }
  }

  if (IsAnyMessage(descriptor_)) {
    initializer_with_arena += ",\n  _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_with_arena += ", _weak_field_map_(arena)";
  }

  string initializer_null;
  initializer_null = ", _internal_metadata_(NULL)";
  if (IsAnyMessage(descriptor_)) {
    initializer_null += ", _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_null += ", _weak_field_map_(NULL)";
  }

  printer->Print(
      "$classname$::$classname$()\n"
      "  : $superclass$()$initializer$ {\n"
      "  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {\n"
      "    $file_namespace$::InitDefaults();\n"
      "  }\n"
      "  SharedCtor();\n"
      "  // @@protoc_insertion_point(constructor:$full_name$)\n"
      "}\n",
      "classname", classname_, "superclass", superclass, "full_name",
      descriptor_->full_name(), "initializer", initializer_null,
      "file_namespace", FileLevelNamespace(descriptor_->file()->name()));

  if (SupportsArenas(descriptor_)) {
    printer->Print(
        "$classname$::$classname$(::google::protobuf::Arena* arena)\n"
        "  : $initializer$ {\n"
        // When arenas are used it's safe to assume we have finished
        // static init time (protos with arenas are unsafe during static init)
        "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
        "  $file_namespace$::InitDefaults();\n"
        "#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
        "  SharedCtor();\n"
        "  RegisterArenaDtor(arena);\n"
        "  // @@protoc_insertion_point(arena_constructor:$full_name$)\n"
        "}\n",
        "initializer", initializer_with_arena, "classname", classname_,
        "superclass", superclass, "full_name", descriptor_->full_name(),
        "file_namespace", FileLevelNamespace(descriptor_->file()->name()));
  }

  // Generate the copy constructor.
  printer->Print(
    "$classname$::$classname$(const $classname$& from)\n"
    "  : $superclass$()",
    "classname", classname_,
    "superclass", superclass,
    "full_name", descriptor_->full_name());
  printer->Indent();
  printer->Indent();
  printer->Indent();

  printer->Print(
      ",\n_internal_metadata_(NULL)");

  if (HasFieldPresence(descriptor_->file())) {
      printer->Print(",\n_has_bits_(from._has_bits_)");
  }

  bool need_to_emit_cached_size = true;
  const string cached_size_decl = ",\n_cached_size_(0)";
  // We reproduce the logic used for laying out _cached_sized_ in the class
  // definition, as to initialize it in-order.
  if (HasFieldPresence(descriptor_->file()) &&
      (HasBitsSize() % 8) != 0) {
    printer->Print(cached_size_decl.c_str());
    need_to_emit_cached_size = false;
  }

  std::vector<bool> processed(optimized_order_.size(), false);
  for (int i = 0; i < optimized_order_.size(); ++i) {
    const FieldDescriptor* field = optimized_order_[i];

    if (!(field->is_repeated() && !(field->is_map()))
        ) {
      continue;
    }

    processed[i] = true;
    printer->Print(",\n$name$_(from.$name$_)",
                   "name", FieldName(field));
  }

  if (need_to_emit_cached_size) {
    printer->Print(cached_size_decl.c_str());
    need_to_emit_cached_size = false;
  }

  if (IsAnyMessage(descriptor_)) {
    printer->Print(",\n_any_metadata_(&type_url_, &value_)");
  }
  if (num_weak_fields_ > 0) {
    printer->Print(",\n_weak_field_map_(from._weak_field_map_)");
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(" {\n");

  printer->Print(
      "_internal_metadata_.MergeFrom(from._internal_metadata_);\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  GenerateConstructorBody(printer, processed, true);

  // Copy oneof fields. Oneof field requires oneof case check.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
        "clear_has_$oneofname$();\n"
        "switch (from.$oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateMergingCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "oneof_index",
        SimpleItoa(descriptor_->oneof_decl(i)->index()),
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  printer->Outdent();
  printer->Print(
    "  // @@protoc_insertion_point(copy_constructor:$full_name$)\n"
    "}\n"
    "\n",
    "full_name", descriptor_->full_name());

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  printer->Print(
    "$classname$::~$classname$() {\n"
    "  // @@protoc_insertion_point(destructor:$full_name$)\n"
    "  SharedDtor();\n"
    "}\n"
    "\n",
    "classname", classname_,
    "full_name", descriptor_->full_name());

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate the arena-specific destructor code.
  if (SupportsArenas(descriptor_)) {
    GenerateArenaDestructorCode(printer);
  }

  // Generate SetCachedSize.
  printer->Print(
    "void $classname$::SetCachedSize(int size) const {\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "  _cached_size_ = size;\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "}\n",
    "classname", classname_);

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file(), options_) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n"
        "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
        "  return "
        "$file_namespace$::file_level_metadata[kIndexInFileMessages]."
        "descriptor;\n"
        "}\n"
        "\n",
        "classname", classname_, "file_namespace",
        FileLevelNamespace(descriptor_->file()->name()));
  }

  printer->Print(
      "const $classname$& $classname$::default_instance() {\n"
      "  $file_namespace$::InitDefaults();\n"
      "  return *internal_default_instance();\n"
      "}\n\n",
      "classname", classname_, "file_namespace",
      FileLevelNamespace(descriptor_->file()->name()));

  if (SupportsArenas(descriptor_)) {
    printer->Print(
      "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n"
      "  return ::google::protobuf::Arena::CreateMessage<$classname$>(arena);\n"
      "}\n",
      "classname", classname_);
  } else {
    printer->Print(
      "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n"
      "  $classname$* n = new $classname$;\n"
      "  if (arena != NULL) {\n"
      "    arena->Own(n);\n"
      "  }\n"
      "  return n;\n"
      "}\n",
      "classname", classname_);
  }

}